

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressDXT.cpp
# Opt level: O3

void __thiscall
nv::SlowCompressor::compressDXT1
          (SlowCompressor *this,Private *compressionOptions,Private *outputOptions)

{
  OutputHandler *pOVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  BlockDXT1 block;
  ColorBlock rgba;
  WeightedClusterFit fit;
  ColourSet colours;
  anon_union_4_2_12391d8d_for_Color32_0 local_594;
  SlowCompressor *local_590;
  Private *local_588;
  BlockDXT1 local_580;
  anon_union_4_2_12391d8d_for_Color32_0 local_578 [16];
  WeightedClusterFit local_538;
  ColourSet local_388;
  
  local_588 = outputOptions;
  uVar3 = Image::width(this->m_image);
  local_590 = this;
  uVar4 = Image::height(this->m_image);
  ColorBlock::ColorBlock((ColorBlock *)&local_578[0].field_0);
  squish::WeightedClusterFit::WeightedClusterFit(&local_538);
  squish::WeightedClusterFit::SetMetric
            (&local_538,(compressionOptions->colorWeight).m_x,(compressionOptions->colorWeight).m_y,
             (compressionOptions->colorWeight).m_z);
  if (uVar4 != 0) {
    uVar6 = 0;
    do {
      if (uVar3 != 0) {
        uVar5 = 0;
        do {
          ColorBlock::init((ColorBlock *)&local_578[0].field_0,(EVP_PKEY_CTX *)local_590->m_image);
          bVar2 = ColorBlock::isSingleColor((ColorBlock *)&local_578[0].field_0);
          if (bVar2) {
            local_594 = local_578[0];
            OptimalCompress::compressDXT1((Color32 *)&local_594.field_0,&local_580);
          }
          else {
            squish::ColourSet::ColourSet(&local_388,(u8 *)&local_578[0].u,0,true);
            squish::WeightedClusterFit::SetColourSet(&local_538,&local_388,1);
            squish::ColourFit::Compress(&local_538.super_ColourFit,&local_580);
          }
          pOVar1 = local_588->outputHandler;
          if (pOVar1 != (OutputHandler *)0x0) {
            (*pOVar1->_vptr_OutputHandler[3])(pOVar1,&local_580,8);
          }
          uVar5 = uVar5 + 4;
        } while (uVar5 < uVar3);
      }
      uVar6 = uVar6 + 4;
    } while (uVar6 < uVar4);
  }
  return;
}

Assistant:

void nv::SlowCompressor::compressDXT1(const CompressionOptions::Private & compressionOptions, const OutputOptions::Private & outputOptions)
{
	const uint w = m_image->width();
	const uint h = m_image->height();
	
	ColorBlock rgba;
	BlockDXT1 block;

	squish::WeightedClusterFit fit;
	//squish::ClusterFit fit;
	//squish::FastClusterFit fit;
	fit.SetMetric(compressionOptions.colorWeight.x(), compressionOptions.colorWeight.y(), compressionOptions.colorWeight.z());

	for (uint y = 0; y < h; y += 4) {
		for (uint x = 0; x < w; x += 4) {
			
			rgba.init(m_image, x, y);
			
			if (rgba.isSingleColor())
			{
				OptimalCompress::compressDXT1(rgba.color(0), &block);
			}
			else
			{
				squish::ColourSet colours((uint8 *)rgba.colors(), 0, true);
				fit.SetColourSet(&colours, squish::kDxt1);
				fit.Compress(&block);
			}
			
			if (outputOptions.outputHandler != NULL) {
				outputOptions.outputHandler->writeData(&block, sizeof(block));
			}
		}
	}
}